

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::
Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
::walkFunctionInModule
          (Walker<wasm::DeadCodeElimination,_wasm::UnifiedExpressionVisitor<wasm::DeadCodeElimination,_void>_>
           *this,Function *func,Module *module)

{
  DeadCodeElimination *this_00;
  
  this->currModule = module;
  this->currFunction = func;
  this_00 = (DeadCodeElimination *)(this[-1].stack.fixed._M_elems + 7);
  DeadCodeElimination::doWalkFunction(this_00,func);
  DeadCodeElimination::visitFunction(this_00,func);
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }